

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O3

_Bool borg_eat_unknown(void)

{
  char *what;
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  if ((ulong)z_info->pack_size != 0) {
    puVar2 = &borg_items->iqty;
    uVar1 = 0xffffffff;
    uVar3 = 0;
    do {
      if (((*puVar2 != '\0') && (puVar2[-4] == '\x1c')) && (*(uint32_t *)(puVar2 + -0xc) == 0)) {
        uVar1 = uVar3 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 0x388;
    } while (z_info->pack_size != uVar3);
    if (-1 < (int)uVar1) {
      what = format("# Eating unknown mushroom %s.",borg_items + uVar1);
      borg_note(what);
      borg_keypress(0x45);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar1]);
      goal_shop = -1;
      goal_ware = -1;
      goal_item = -1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_eat_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_FOOD)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Log the message */
    borg_note(format("# Eating unknown mushroom %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('E');
    borg_keypress(all_letters_nohjkl[n]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}